

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O2

StrList * DirUtils::GetDirFiles(StrList *__return_storage_ptr__,string *p)

{
  DIR *__dirp;
  dirent *pdVar1;
  allocator local_41;
  value_type local_40;
  
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node._M_size = 0;
  __dirp = opendir((p->_M_dataplus)._M_p);
  while( true ) {
    pdVar1 = readdir(__dirp);
    if (pdVar1 == (dirent *)0x0) break;
    std::__cxx11::string::string((string *)&local_40,pdVar1->d_name,&local_41);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

StrList DirUtils::GetDirFiles(const string& p){
	StrList sl;
	DIR* dir = opendir(p.c_str());
	struct dirent *dirp = nullptr;
	while((dirp = readdir(dir)) != NULL){
		sl.push_back(string(dirp->d_name));
	}
	return sl;
}